

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

vm_obj_id_t __thiscall
CVmTimeZone::get_history_item(CVmTimeZone *this,int32_t dayno,int32_t daytime)

{
  vm_obj_id_t vVar1;
  vmtz_trans t;
  vmtz_ttype tty;
  vmtzquery result;
  vmtz_trans vStack_48;
  vmtz_ttype local_38;
  int32_t local_28;
  int32_t local_24;
  vmtz_trans *in_stack_ffffffffffffffe0;
  
  query(this,(vmtzquery *)CONCAT44(dayno,daytime),result.abbr._4_4_,(int32_t)result.abbr,result.save
       );
  vmtz_ttype::vmtz_ttype(&local_38,(vmtzquery *)&local_28);
  vmtz_trans::vmtz_trans(&vStack_48,local_28,local_24,&local_38);
  vVar1 = vmtz_trans::get_as_list(in_stack_ffffffffffffffe0);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmTimeZone::get_history_item(
    VMG_ int32_t dayno, int32_t daytime) const
{
    /* query the transition for the given date/time */
    vmtzquery result;
    query(&result, dayno, daytime, FALSE);

    /* synthesize a transition description */
    vmtz_ttype tty(&result);
    vmtz_trans t(result.start_dayno, result.start_daytime, &tty);

    /* build and return the List representation */
    return t.get_as_list(vmg0_);
}